

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O0

shared_ptr<gutil::PropertyNode> * __thiscall
gutil::PropertyNode::getChild(PropertyNode *this,string *_name)

{
  pointer psVar1;
  __type _Var2;
  pointer psVar3;
  element_type *this_00;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t i;
  vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
  local_30 [2];
  
  local_30[0].
  super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    psVar1 = local_30[0].
             super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    psVar3 = (pointer)std::
                      vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                      ::size((vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                              *)(in_RDI + 0x40));
    if (psVar3 <= psVar1) {
      __x = in_RDI + 0x40;
      this_01 = local_30;
      std::make_shared<gutil::PropertyNode,std::__cxx11::string_const&>(in_stack_ffffffffffffffc8);
      std::
      vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
      ::push_back(this_01,(value_type *)__x);
      std::shared_ptr<gutil::PropertyNode>::~shared_ptr((shared_ptr<gutil::PropertyNode> *)0x11c5a0)
      ;
      pvVar4 = std::
               vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
               ::back(this_01);
      return pvVar4;
    }
    std::
    vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
    ::operator[]((vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                  *)(in_RDI + 0x40),
                 (size_type)
                 local_30[0].
                 super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_00 = std::
              __shared_ptr_access<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x11c51b);
    getName_abi_cxx11_(this_00);
    _Var2 = std::operator==(in_stack_ffffffffffffffc0,in_RDI);
    if (_Var2) break;
    local_30[0].
    super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&((local_30[0].
                            super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                          super___shared_ptr<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr + 1);
  }
  pvVar4 = std::
           vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
           ::operator[]((vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                         *)(in_RDI + 0x40),
                        (size_type)
                        local_30[0].
                        super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return pvVar4;
}

Assistant:

std::shared_ptr<PropertyNode> &getChild(const std::string &_name)
    {
      for (size_t i=0; i<list.size(); i++)
      {
        if (_name == list[i]->getName())
        {
          return list[i];
        }
      }

      list.push_back(std::make_shared<PropertyNode>(_name));

      return list.back();
    }